

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ObjCheckTfi_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  int iVar1;
  void **__ptr;
  uint uVar2;
  
  while( true ) {
    if (pNode == (Gia_Obj_t *)0x0) {
      return 0;
    }
    uVar2 = (uint)*(ulong *)pNode;
    if ((~uVar2 & 0x9fffffff) == 0) {
      return 0;
    }
    if (pNode == pOld) {
      return 1;
    }
    if ((uVar2 >> 0x1e & 1) != 0) break;
    *(ulong *)pNode = *(ulong *)pNode | 0x40000000;
    iVar1 = vVisited->nSize;
    if (iVar1 == vVisited->nCap) {
      uVar2 = iVar1 * 2;
      if (iVar1 < 0x10) {
        uVar2 = 0x10;
      }
      __ptr = vVisited->pArray;
      if (iVar1 < (int)uVar2) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc((ulong)uVar2 << 3);
        }
        else {
          __ptr = (void **)realloc(__ptr,(ulong)uVar2 << 3);
          iVar1 = vVisited->nSize;
        }
        vVisited->pArray = __ptr;
        vVisited->nCap = uVar2;
      }
    }
    else {
      __ptr = vVisited->pArray;
    }
    vVisited->nSize = iVar1 + 1;
    __ptr[iVar1] = pNode;
    iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)((uint)*(undefined8 *)pNode & 0x1fffffff),
                                vVisited);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff),
                                vVisited);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Gia_ObjId(p,pNode);
    pNode = Gia_ObjNextObj(p,iVar1);
  }
  return 0;
}

Assistant:

int Gia_ObjCheckTfi_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->fMark0 )
        return 0;
    pNode->fMark0 = 1;
    Vec_PtrPush( vVisited, pNode );
    // check the children
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin0(pNode), vVisited ) )
        return 1;
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin1(pNode), vVisited ) )
        return 1;
    // check equivalent nodes
    return Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjNextObj(p, Gia_ObjId(p, pNode)), vVisited );
}